

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void __thiscall sznet::TimerQueue::addTimerInLoop(TimerQueue *this,Timer *timer)

{
  uint32_t uVar1;
  size_type sVar2;
  pair<std::_Rb_tree_const_iterator<std::pair<sznet::Timer_*,_long>_>,_bool> pVar3;
  int64_t local_40;
  pair<sznet::Timer_*,_long> local_38;
  _Base_ptr local_28;
  pair<std::_Rb_tree_const_iterator<std::pair<sznet::Timer_*,_long>_>,_bool> result;
  Timer *timer_local;
  TimerQueue *this_local;
  
  result._8_8_ = timer;
  sznet::net::EventLoop::assertInLoopThread(this->m_loop);
  uVar1 = MinHeap<sznet::Timer>::size(&this->m_timerMinHeap);
  sVar2 = std::
          set<std::pair<sznet::Timer_*,_long>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
          ::size(&this->m_activeTimers);
  if (uVar1 != sVar2) {
    __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                  ,0x46,"void sznet::TimerQueue::addTimerInLoop(Timer *)");
  }
  MinHeap<sznet::Timer>::push(&this->m_timerMinHeap,(Timer *)result._8_8_);
  local_40 = Timer::sequence((Timer *)result._8_8_);
  std::pair<sznet::Timer_*,_long>::pair<sznet::Timer_*&,_long,_true>
            (&local_38,(Timer **)&result.second,&local_40);
  pVar3 = std::
          set<std::pair<sznet::Timer_*,_long>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
          ::insert(&this->m_activeTimers,&local_38);
  local_28 = (_Base_ptr)pVar3.first._M_node;
  result.first._M_node._0_1_ = pVar3.second;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    uVar1 = MinHeap<sznet::Timer>::size(&this->m_timerMinHeap);
    sVar2 = std::
            set<std::pair<sznet::Timer_*,_long>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
            ::size(&this->m_activeTimers);
    if (uVar1 == sVar2) {
      return;
    }
    __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                  ,0x4a,"void sznet::TimerQueue::addTimerInLoop(Timer *)");
  }
  __assert_fail("result.second",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                ,0x49,"void sznet::TimerQueue::addTimerInLoop(Timer *)");
}

Assistant:

void TimerQueue::addTimerInLoop(Timer* timer)
{
	m_loop->assertInLoopThread();
	assert(m_timerMinHeap.size() == m_activeTimers.size());
	m_timerMinHeap.push(timer);
	std::pair<ActiveTimerSet::iterator, bool> result = m_activeTimers.insert(ActiveTimer(timer, timer->sequence()));
	assert(result.second); (void)result;
	assert(m_timerMinHeap.size() == m_activeTimers.size());
}